

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O3

double __thiscall trng::zero_truncated_poisson_dist::pdf(zero_truncated_poisson_dist *this,int x)

{
  double dVar1;
  double dVar2;
  
  if (0 < x) {
    dVar1 = lgamma((double)(x + 1));
    dVar2 = log((this->P).mu_);
    dVar1 = exp(dVar2 * (double)x - dVar1);
    dVar2 = expm1((this->P).mu_);
    return dVar1 / dVar2;
  }
  return 0.0;
}

Assistant:

double pdf(int x) const {
      return x <= 0 ? 0.0
                    : math::exp(-math::ln_Gamma(x + 1.0) + x * math::ln(P.mu())) /
                          math::expm1(P.mu());
    }